

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

QMenuBar * __thiscall MenuBar::createMenuBar(MenuBar *this,QMainWindow *mainWindow)

{
  QAction *pQVar1;
  QMenu *pQVar2;
  mapped_type *pmVar3;
  QMenuBar *this_00;
  QString local_a0;
  key_type local_88 [2];
  QAction *local_80;
  QMenuBar *menuBar;
  key_type local_70 [4];
  QString local_60;
  undefined1 local_45;
  QString local_38;
  QMenu *local_20;
  QMenu *fileMenu;
  QMainWindow *mainWindow_local;
  MenuBar *this_local;
  
  fileMenu = (QMenu *)mainWindow;
  mainWindow_local = (QMainWindow *)this;
  pQVar2 = (QMenu *)operator_new(0x28);
  local_45 = 1;
  QString::QString(&local_38,"File");
  QMenu::QMenu(pQVar2,(QString *)&local_38,(QWidget *)fileMenu);
  local_45 = 0;
  QString::~QString(&local_38);
  local_20 = pQVar2;
  QString::QString(&local_60,"padding-left:10px;");
  QWidget::setStyleSheet((QString *)pQVar2);
  QString::~QString(&local_60);
  pQVar2 = local_20;
  local_70[3] = 2;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,local_70 + 3);
  QWidget::addAction((QAction *)pQVar2);
  QMenu::addSeparator();
  pQVar2 = local_20;
  local_70[2] = 3;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,local_70 + 2);
  QWidget::addAction((QAction *)pQVar2);
  local_70[1] = 3;
  pmVar3 = std::
           map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
           ::at(&this->mapAction,local_70 + 1);
  QAction::setEnabled(SUB81(pmVar3,0));
  QMenu::addSeparator();
  pQVar2 = local_20;
  local_70[0] = SAVE_BOARD;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,local_70);
  QWidget::addAction((QAction *)pQVar2);
  QMenu::addSeparator();
  pQVar2 = local_20;
  menuBar._4_4_ = 1;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,(key_type *)((long)&menuBar + 4));
  QWidget::addAction((QAction *)pQVar2);
  this_00 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_00,(QWidget *)fileMenu);
  local_80 = (QAction *)this_00;
  QMenuBar::addMenu((QMenu *)this_00);
  pQVar1 = local_80;
  local_88[1] = 5;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,local_88 + 1);
  QWidget::addAction(pQVar1);
  pQVar1 = local_80;
  local_88[0] = ABOUT;
  std::
  map<ActionMenu,_QAction,_std::less<ActionMenu>,_std::allocator<std::pair<const_ActionMenu,_QAction>_>_>
  ::at(&this->mapAction,local_88);
  QWidget::addAction(pQVar1);
  pQVar1 = local_80;
  QString::QString(&local_a0,"padding-left: 5px; margin: 3px;");
  QWidget::setStyleSheet((QString *)pQVar1);
  QString::~QString(&local_a0);
  return (QMenuBar *)local_80;
}

Assistant:

QMenuBar* MenuBar::createMenuBar( QMainWindow* mainWindow )
{
    QMenu* fileMenu = new QMenu( "File", mainWindow );
    fileMenu->setStyleSheet( "padding-left:10px;" );

    using enum ActionMenu;
    fileMenu->addAction( &mapAction.at( OPEN_GRAPHIC ));
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( REM_GRAPHIC ));
    mapAction.at( REM_GRAPHIC ).setEnabled( false );
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( SAVE_BOARD ));
    fileMenu->addSeparator();
    fileMenu->addAction( &mapAction.at( LOAD_BOARD ));

    QMenuBar* menuBar = new QMenuBar( mainWindow );
    menuBar->addMenu( fileMenu );
    menuBar->addAction( &mapAction.at( SETTINGS ));
    menuBar->addAction( &mapAction.at( ABOUT ));
    menuBar->setStyleSheet( "padding-left: 5px; margin: 3px;" );
    return menuBar;
}